

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O3

void __thiscall
cmExtraCodeBlocksGenerator::CreateProjectFile
          (cmExtraCodeBlocksGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs)

{
  pointer pcVar1;
  string *psVar2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string outputDir;
  string projectName;
  string filename;
  string sessionFilename;
  long *local_118;
  size_t local_110;
  long local_108 [2];
  string local_f8;
  string local_d8;
  string local_b8;
  undefined8 local_98;
  undefined1 *local_90;
  undefined1 local_88 [32];
  basic_string_view<char,_std::char_traits<char>_> local_68;
  undefined8 local_58;
  undefined1 *local_50;
  size_type local_48;
  pointer local_40;
  undefined8 local_38;
  char *local_30;
  
  psVar2 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                     (*(lgs->
                       super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                       _M_impl.super__Vector_impl_data._M_start);
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  local_118 = local_108;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,pcVar1,pcVar1 + psVar2->_M_string_length);
  cmLocalGenerator::GetProjectName_abi_cxx11_
            (&local_f8,
             *(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
              _M_impl.super__Vector_impl_data._M_start);
  local_98 = 1;
  local_88[0] = 0x2f;
  local_68._M_len = local_110;
  local_68._M_str = (char *)local_118;
  local_58 = 1;
  local_48 = local_f8._M_string_length;
  local_40 = local_f8._M_dataplus._M_p;
  local_38 = 4;
  local_30 = ".cbp";
  views._M_len = 4;
  views._M_array = &local_68;
  local_90 = local_88;
  local_50 = local_88;
  cmCatViews_abi_cxx11_(&local_d8,views);
  local_98 = 1;
  local_88[0] = 0x2f;
  local_68._M_len = local_110;
  local_68._M_str = (char *)local_118;
  local_58 = 1;
  local_48 = local_f8._M_string_length;
  local_40 = local_f8._M_dataplus._M_p;
  local_38 = 7;
  local_30 = ".layout";
  views_00._M_len = 4;
  views_00._M_array = &local_68;
  local_90 = local_88;
  local_50 = local_88;
  cmCatViews_abi_cxx11_(&local_b8,views_00);
  CreateNewProjectFile(this,lgs,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_118 != local_108) {
    operator_delete(local_118,local_108[0] + 1);
  }
  return;
}

Assistant:

void cmExtraCodeBlocksGenerator::CreateProjectFile(
  const std::vector<cmLocalGenerator*>& lgs)
{
  std::string outputDir = lgs[0]->GetCurrentBinaryDirectory();
  std::string projectName = lgs[0]->GetProjectName();

  std::string filename = cmStrCat(outputDir, '/', projectName, ".cbp");
  std::string sessionFilename =
    cmStrCat(outputDir, '/', projectName, ".layout");

  this->CreateNewProjectFile(lgs, filename);
}